

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O0

void __thiscall
testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
          (HasNewFatalFailureHelper *this)

{
  UnitTestImpl *this_00;
  TestPartResultReporterInterface *in_RDI;
  
  in_RDI->_vptr_TestPartResultReporterInterface =
       (_func_int **)&PTR__HasNewFatalFailureHelper_001f6518;
  this_00 = GetUnitTestImpl();
  UnitTestImpl::SetTestPartResultReporterForCurrentThread(this_00,in_RDI);
  TestPartResultReporterInterface::~TestPartResultReporterInterface(in_RDI);
  return;
}

Assistant:

HasNewFatalFailureHelper::~HasNewFatalFailureHelper() {
  GetUnitTestImpl()->SetTestPartResultReporterForCurrentThread(
      original_reporter_);
}